

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# subject_comparator_test.cpp
# Opt level: O2

void __thiscall
bidfx_public_api::price::subject::
SubjectComparatorTest_test_compare_identical_with_missing_symbol_Test::TestBody
          (SubjectComparatorTest_test_compare_identical_with_missing_symbol_Test *this)

{
  char *pcVar1;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_68;
  AssertHelper local_60;
  AssertionResult gtest_ar;
  Subject subject2;
  Subject subject1;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&gtest_ar,"Quantity=2000000.00,Account=AAA",(allocator<char> *)&subject2);
  bidfx_public_api::price::subject::SubjectUtils::CreateSubjectFromString((string *)&subject1);
  std::__cxx11::string::~string((string *)&gtest_ar);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&gtest_ar,"Quantity=2000000.00,Account=AAA",(allocator<char> *)&local_68);
  bidfx_public_api::price::subject::SubjectUtils::CreateSubjectFromString((string *)&subject2);
  std::__cxx11::string::~string((string *)&gtest_ar);
  local_68.ptr_._0_4_ = 0;
  local_60.data_._0_4_ =
       bidfx_public_api::price::subject::SubjectComparatorUtils::Compare(&subject1,&subject2);
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)&gtest_ar,"0","SubjectComparatorUtils::Compare(subject1, subject2)",
             (int *)&local_68,(int *)&local_60);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_68);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_60,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bidfx[P]bidfx-api-cpp/test/price/subject/subject_comparator_test.cpp"
               ,0x75,pcVar1);
    testing::internal::AssertHelper::operator=(&local_60,(Message *)&local_68);
    testing::internal::AssertHelper::~AssertHelper(&local_60);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr(&local_68);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  local_68.ptr_._0_4_ = 0;
  local_60.data_._0_4_ =
       bidfx_public_api::price::subject::SubjectComparatorUtils::Compare(&subject2,&subject1);
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)&gtest_ar,"0","SubjectComparatorUtils::Compare(subject2, subject1)",
             (int *)&local_68,(int *)&local_60);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_68);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_60,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bidfx[P]bidfx-api-cpp/test/price/subject/subject_comparator_test.cpp"
               ,0x76,pcVar1);
    testing::internal::AssertHelper::operator=(&local_60,(Message *)&local_68);
    testing::internal::AssertHelper::~AssertHelper(&local_60);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr(&local_68);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&subject2);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&subject1);
  return;
}

Assistant:

TEST(SubjectComparatorTest, test_compare_identical_with_missing_symbol)
{
    Subject subject1 = SubjectUtils::CreateSubjectFromString("Quantity=2000000.00,Account=AAA");
    Subject subject2 = SubjectUtils::CreateSubjectFromString("Quantity=2000000.00,Account=AAA");
    EXPECT_EQ(0, SubjectComparatorUtils::Compare(subject1, subject2));
    EXPECT_EQ(0, SubjectComparatorUtils::Compare(subject2, subject1));
}